

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O1

Aig_Man_t * Iso_ManFilterPos(Aig_Man_t *pAig,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  undefined8 *__ptr;
  int *piVar1;
  Vec_Str_t *pVVar2;
  int iVar3;
  void *pvVar4;
  Aig_Man_t *pAVar5;
  Aig_Man_t *pMan;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  undefined8 *puVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  size_t __size;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  timespec ts;
  uint local_ac;
  timespec local_a8;
  uint *local_98;
  double local_90;
  int local_84;
  double local_80;
  Aig_Man_t *local_78;
  Aig_Man_t *local_70;
  long local_68;
  ulong local_60;
  long local_58;
  long local_50;
  Vec_Ptr_t **local_48;
  Vec_Str_t *local_40;
  Aig_Man_t *local_38;
  
  local_84 = fVerbose;
  clock_gettime(3,&local_a8);
  *pvPosEquivs = (Vec_Ptr_t *)0x0;
  uVar14 = pAig->nObjs[3] - pAig->nRegs;
  iVar3 = 0x10;
  local_78 = pAig;
  local_48 = pvPosEquivs;
  local_98 = (uint *)malloc(0x10);
  uVar11 = 8;
  if (6 < uVar14 - 1) {
    uVar11 = uVar14;
  }
  local_98[1] = 0;
  *local_98 = uVar11;
  local_60 = (ulong)uVar14;
  if (uVar11 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    __size = (long)(int)uVar11 << 3;
    pvVar4 = malloc(__size);
    iVar3 = (int)__size;
  }
  *(void **)(local_98 + 2) = pvVar4;
  local_ac = 0;
  if ((int)local_60 < 1) {
    dVar23 = 0.0;
    dVar22 = 0.0;
    pAVar5 = (Aig_Man_t *)0x0;
  }
  else {
    local_90 = 0.0;
    lVar16 = 0;
    lVar18 = 0;
    do {
      if ((local_ac * -0x3d70a3d7 + 0x51eb850 >> 2 | local_ac * 0x40000000) < 0x28f5c29) {
        printf("%6d finished...\r");
      }
      iVar3 = clock_gettime(3,&local_a8);
      if (iVar3 < 0) {
        local_80 = 4.94065645841247e-324;
      }
      else {
        lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
        local_80 = (double)(((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_a8.tv_sec * -1000000);
      }
      pAVar5 = Saig_ManDupCones(local_78,(int *)&local_ac,1);
      iVar3 = clock_gettime(3,&local_a8);
      if (iVar3 < 0) {
        local_50 = -1;
      }
      else {
        local_50 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
      }
      iVar3 = clock_gettime(3,&local_a8);
      if (iVar3 < 0) {
        local_58 = 1;
      }
      else {
        lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
        local_58 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_a8.tv_sec * -1000000;
      }
      pMan = Saig_ManDupIsoCanonical(pAVar5,0);
      iVar3 = clock_gettime(3,&local_a8);
      if (iVar3 < 0) {
        lVar12 = -1;
      }
      else {
        lVar12 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
      }
      local_70 = pAVar5;
      iVar3 = clock_gettime(3,&local_a8);
      if (iVar3 < 0) {
        lVar13 = 1;
      }
      else {
        lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
        lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_a8.tv_sec * -1000000;
      }
      local_38 = pMan;
      local_40 = Ioa_WriteAigerIntoMemoryStr(pMan);
      iVar3 = clock_gettime(3,&local_a8);
      if (iVar3 < 0) {
        lVar20 = -1;
      }
      else {
        lVar20 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
      }
      lVar17 = (long)(int)local_98[1];
      uVar11 = *local_98;
      if (local_98[1] == uVar11) {
        if ((int)uVar11 < 0x10) {
          if (*(void **)(local_98 + 2) == (void *)0x0) {
            local_68 = lVar17;
            pvVar4 = malloc(0x80);
          }
          else {
            local_68 = lVar17;
            pvVar4 = realloc(*(void **)(local_98 + 2),0x80);
          }
          uVar14 = 0x10;
        }
        else {
          uVar14 = uVar11 * 2;
          if ((int)uVar14 <= (int)uVar11) goto LAB_00626904;
          if (*(void **)(local_98 + 2) == (void *)0x0) {
            local_68 = lVar17;
            pvVar4 = malloc((ulong)uVar11 << 4);
          }
          else {
            local_68 = lVar17;
            pvVar4 = realloc(*(void **)(local_98 + 2),(ulong)uVar11 << 4);
          }
        }
        *(void **)(local_98 + 2) = pvVar4;
        *local_98 = uVar14;
        lVar17 = local_68;
      }
LAB_00626904:
      pVVar2 = local_40;
      lVar18 = lVar18 + (long)local_80 + local_50;
      local_90 = (double)((long)local_90 + local_58 + lVar12);
      lVar16 = lVar16 + lVar13 + lVar20;
      local_98[1] = (int)lVar17 + 1;
      *(Vec_Str_t **)(*(long *)(local_98 + 2) + lVar17 * 8) = local_40;
      Aig_ManStop(local_38);
      pAVar5 = local_70;
      Aig_ManStop(local_70);
      iVar3 = (int)pAVar5;
      pVVar2->nCap = local_ac;
      local_ac = local_ac + 1;
    } while ((int)local_ac < (int)local_60);
    dVar23 = (double)lVar18;
    pAVar5 = (Aig_Man_t *)(double)(long)local_90;
    dVar22 = (double)lVar16;
  }
  if (local_84 != 0) {
    local_90 = dVar22;
    local_80 = dVar23;
    local_70 = pAVar5;
    Abc_Print(iVar3,"%s =","Duplicate time");
    Abc_Print(iVar3,"%9.2f sec\n",local_80 / 1000000.0);
    Abc_Print(iVar3,"%s =","Isomorph  time");
    Abc_Print(iVar3,"%9.2f sec\n",(double)local_70 / 1000000.0);
    Abc_Print(iVar3,"%s =","AIGER     time");
    Abc_Print(iVar3,"%9.2f sec\n",local_90 / 1000000.0);
  }
  clock_gettime(3,&local_a8);
  uVar11 = local_98[1];
  if (1 < (long)(int)uVar11) {
    qsort(*(void **)(local_98 + 2),(long)(int)uVar11,8,Iso_StoCompareVecStr);
  }
  iVar3 = clock_gettime(3,&local_a8);
  if (iVar3 < 0) {
    local_90 = 4.94065645841247e-324;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
    local_90 = (double)(((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_a8.tv_sec * -1000000);
  }
  iVar3 = local_78->nTruePos;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  iVar15 = 8;
  if (6 < iVar3 - 1U) {
    iVar15 = iVar3;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar15;
  if (iVar15 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)iVar15 << 3);
  }
  pVVar6->pArray = ppvVar7;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x10;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(0x40);
  pVVar8->pArray = piVar9;
  if (iVar15 == 0) {
    if (ppvVar7 == (void **)0x0) {
      ppvVar7 = (void **)malloc(0x80);
    }
    else {
      ppvVar7 = (void **)realloc(ppvVar7,0x80);
    }
    pVVar6->pArray = ppvVar7;
    pVVar6->nCap = 0x10;
  }
  pVVar6->nSize = 1;
  *pVVar6->pArray = pVVar8;
  if ((int)uVar11 < 1) {
LAB_00626eee:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  __ptr = *(undefined8 **)(local_98 + 2);
  piVar9 = (int *)*__ptr;
  Vec_IntPush(pVVar8,*piVar9);
  local_ac = 1;
  if (uVar11 != 1) {
    do {
      if ((int)local_ac < 0) goto LAB_00626eee;
      piVar1 = (int *)__ptr[local_ac];
      if (piVar1 == (int *)0x0) {
        iVar3 = 1;
      }
      else {
        iVar3 = piVar9[1];
        if (iVar3 == piVar1[1]) {
          iVar3 = memcmp(*(void **)(piVar9 + 2),*(void **)(piVar1 + 2),(long)iVar3);
        }
        else {
          iVar3 = iVar3 - piVar1[1];
        }
      }
      if (iVar3 != 0) {
        puVar10 = (undefined8 *)malloc(0x10);
        *puVar10 = 0x10;
        pvVar4 = malloc(0x40);
        puVar10[1] = pvVar4;
        uVar14 = pVVar6->nCap;
        if (pVVar6->nSize == uVar14) {
          if ((int)uVar14 < 0x10) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
            }
            iVar3 = 0x10;
          }
          else {
            iVar3 = uVar14 * 2;
            if (iVar3 <= (int)uVar14) goto LAB_00626d29;
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)uVar14 << 4);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)uVar14 << 4);
            }
          }
          pVVar6->pArray = ppvVar7;
          pVVar6->nCap = iVar3;
        }
LAB_00626d29:
        iVar3 = pVVar6->nSize;
        pVVar6->nSize = iVar3 + 1;
        pVVar6->pArray[iVar3] = puVar10;
      }
      if ((long)pVVar6->nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
      }
      Vec_IntPush((Vec_Int_t *)pVVar6->pArray[(long)pVVar6->nSize + -1],*piVar1);
      local_ac = local_ac + 1;
      piVar9 = piVar1;
    } while ((int)local_ac < (int)uVar11);
  }
  uVar21 = 1;
  if (1 < (int)local_98[1]) {
    uVar21 = (ulong)local_98[1];
  }
  uVar19 = 0;
  do {
    pvVar4 = (void *)__ptr[uVar19];
    if (pvVar4 != (void *)0x0) {
      if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar4 + 8));
        *(undefined8 *)((long)pvVar4 + 8) = 0;
      }
      free(pvVar4);
    }
    uVar19 = uVar19 + 1;
  } while (uVar21 != uVar19);
  free(__ptr);
  local_98[2] = 0;
  local_98[3] = 0;
  free(local_98);
  if (local_84 != 0) {
    iVar15 = 3;
    iVar3 = clock_gettime(3,&local_a8);
    if (iVar3 < 0) {
      lVar16 = -1;
    }
    else {
      lVar16 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
    }
    lVar16 = lVar16 + (long)local_90;
    Abc_Print(iVar15,"%s =","Sorting   time");
    Abc_Print(iVar15,"%9.2f sec\n",(double)lVar16 / 1000000.0);
  }
  local_ac = 0;
  iVar3 = pVVar6->nSize;
  if (0 < iVar3) {
    do {
      if ((int)local_ac < 0) goto LAB_00626eee;
      qsort(*(void **)((long)pVVar6->pArray[local_ac] + 8),
            (long)*(int *)((long)pVVar6->pArray[local_ac] + 4),4,Vec_IntSortCompare1);
      local_ac = local_ac + 1;
      iVar3 = pVVar6->nSize;
    } while ((int)local_ac < iVar3);
  }
  qsort(pVVar6->pArray,(long)iVar3,8,Vec_VecSortCompare3);
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(400);
  pVVar8->pArray = piVar9;
  local_ac = 0;
  if (0 < pVVar6->nSize) {
    do {
      if ((int)local_ac < 0) goto LAB_00626eee;
      if (*(int *)((long)pVVar6->pArray[local_ac] + 4) < 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(pVVar8,**(int **)((long)pVVar6->pArray[local_ac] + 8));
      local_ac = local_ac + 1;
    } while ((int)local_ac < pVVar6->nSize);
  }
  piVar9 = pVVar8->pArray;
  pAVar5 = Saig_ManDupCones(local_78,piVar9,pVVar8->nSize);
  if (piVar9 != (int *)0x0) {
    free(piVar9);
    pVVar8->pArray = (int *)0x0;
  }
  free(pVVar8);
  *local_48 = pVVar6;
  return pAVar5;
}

Assistant:

Aig_Man_t * Iso_ManFilterPos( Aig_Man_t * pAig, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
//    int fVeryVerbose = 0;
    Aig_Man_t * pPart, * pTemp;
    Vec_Ptr_t * vBuffers, * vClasses;
    Vec_Int_t * vLevel, * vRemain;
    Vec_Str_t * vStr, * vPrev;
    int i, nPos;
    abctime clk = Abc_Clock();
    abctime clkDup = 0, clkAig = 0, clkIso = 0, clk2;
    *pvPosEquivs = NULL;

    // derive AIG for each PO
    nPos = Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig);
    vBuffers = Vec_PtrAlloc( nPos );
    for ( i = 0; i < nPos; i++ )
    {
        if ( i % 100 == 0 )
            printf( "%6d finished...\r", i );

        clk2 = Abc_Clock();
        pPart = Saig_ManDupCones( pAig, &i, 1 );
        clkDup += Abc_Clock() - clk2;

        clk2 = Abc_Clock();
        pTemp = Saig_ManDupIsoCanonical( pPart, 0 );
        clkIso += Abc_Clock() - clk2;

        clk2 = Abc_Clock();
        vStr  = Ioa_WriteAigerIntoMemoryStr( pTemp );
        clkAig += Abc_Clock() - clk2;

        Vec_PtrPush( vBuffers, vStr );
        Aig_ManStop( pTemp );
        Aig_ManStop( pPart );
        // remember the output number in nCap (attention: hack!)
        vStr->nCap = i;
    }
//    s_Counter = 0;
    if ( fVerbose )
    {
    Abc_PrintTime( 1, "Duplicate time", clkDup );
    Abc_PrintTime( 1, "Isomorph  time", clkIso );
    Abc_PrintTime( 1, "AIGER     time", clkAig );
    }

    // sort the infos
    clk = Abc_Clock();
    Vec_PtrSort( vBuffers, (int (*)(void))Iso_StoCompareVecStr );

    // create classes
    clk = Abc_Clock();
    vClasses = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
    // start the first class
    Vec_PtrPush( vClasses, (vLevel = Vec_IntAlloc(4)) );
    vPrev = (Vec_Str_t *)Vec_PtrEntry( vBuffers, 0 );
    Vec_IntPush( vLevel, vPrev->nCap );
    // consider other classes
    Vec_PtrForEachEntryStart( Vec_Str_t *, vBuffers, vStr, i, 1 )
    {
        if ( Vec_StrCompareVec(vPrev, vStr) )
            Vec_PtrPush( vClasses, Vec_IntAlloc(4) );
        vLevel = (Vec_Int_t *)Vec_PtrEntryLast( vClasses );
        Vec_IntPush( vLevel, vStr->nCap );
        vPrev = vStr;
    }
    Vec_VecFree( (Vec_Vec_t *)vBuffers );

    if ( fVerbose )
    Abc_PrintTime( 1, "Sorting   time", Abc_Clock() - clk );
//    Abc_PrintTime( 1, "Traversal time", time_Trav );

    // report the results
//    Vec_VecPrintInt( (Vec_Vec_t *)vClasses );
//    printf( "Devided %d outputs into %d cand equiv classes.\n", Saig_ManPoNum(pAig), Vec_PtrSize(vClasses) );
/*
    if ( fVerbose )
    {
        Vec_PtrForEachEntry( Vec_Int_t *, vClasses, vLevel, i )
            if ( Vec_IntSize(vLevel) > 1 )
                printf( "%d ", Vec_IntSize(vLevel) );
            else
                nUnique++;
        printf( " Unique = %d\n", nUnique );
    }
*/

    // canonicize order
    Vec_PtrForEachEntry( Vec_Int_t *, vClasses, vLevel, i )
        Vec_IntSort( vLevel, 0 );
     Vec_VecSortByFirstInt( (Vec_Vec_t *)vClasses, 0 );
       
    // collect the first ones
    vRemain = Vec_IntAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Int_t *, vClasses, vLevel, i )
        Vec_IntPush( vRemain, Vec_IntEntry(vLevel, 0) );

    // derive the resulting AIG
    pPart = Saig_ManDupCones( pAig, Vec_IntArray(vRemain), Vec_IntSize(vRemain) );
    Vec_IntFree( vRemain );

//    return (Vec_Vec_t *)vClasses;
//    Vec_VecFree( (Vec_Vec_t *)vClasses );
    *pvPosEquivs = vClasses;
    return pPart;
}